

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_io.h
# Opt level: O1

size_t __thiscall
dmlc::MemoryFixedSizeStream::Read(MemoryFixedSizeStream *this,void *ptr,size_t size)

{
  ulong __n;
  LogMessageFatal LStack_1a8;
  
  if (this->buffer_size_ < this->curr_ptr_ + size) {
    LogMessageFatal::LogMessageFatal
              (&LStack_1a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/3rdparty/dmlc-core/include/dmlc/memory_io.h"
               ,0x22);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&LStack_1a8,"Check failed: curr_ptr_ + size <= buffer_size_",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&LStack_1a8,": ",2);
    LogMessageFatal::~LogMessageFatal(&LStack_1a8);
  }
  __n = this->buffer_size_ - this->curr_ptr_;
  if (size <= __n) {
    __n = size;
  }
  if (__n != 0) {
    memcpy(ptr,this->p_buffer_ + this->curr_ptr_,__n);
  }
  this->curr_ptr_ = this->curr_ptr_ + __n;
  return __n;
}

Assistant:

virtual size_t Read(void *ptr, size_t size) {
    CHECK(curr_ptr_ + size <= buffer_size_);
    size_t nread = std::min(buffer_size_ - curr_ptr_, size);
    if (nread != 0)
      std::memcpy(ptr, p_buffer_ + curr_ptr_, nread);
    curr_ptr_ += nread;
    return nread;
  }